

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall
TPZFront<std::complex<float>_>::TPZFront(TPZFront<std::complex<float>_> *this,void **vtt)

{
  undefined8 *in_RSI;
  TPZStack<int,_10> *in_RDI;
  TPZManVector<long,_10> *in_stack_ffffffffffffffe0;
  
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,(void **)(in_RSI + 1));
  (in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>._vptr_TPZVec = (_func_int **)*in_RSI;
  TPZManVector<long,_10>::TPZManVector
            (in_stack_ffffffffffffffe0,
             (int64_t)&(in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>.fNElements);
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI[1].super_TPZManVector<int,_10>.fExtAlloc + 6));
  TPZStack<int,_10>::TPZStack(in_RDI);
  TPZVec<std::complex<float>_>::TPZVec
            ((TPZVec<std::complex<float>_> *)in_RDI[3].super_TPZManVector<int,_10>.fExtAlloc);
  in_RDI[3].super_TPZManVector<int,_10>.fExtAlloc[8] = 200;
  in_RDI[2].super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements = 0;
  *(undefined4 *)((long)&(in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>.fStore + 4) = 0;
  *(undefined4 *)&(in_RDI->super_TPZManVector<int,_10>).super_TPZVec<int>.fStore = 0;
  in_RDI[2].super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc = 0;
  in_RDI[4].super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x0;
  in_RDI[3].super_TPZManVector<int,_10>.fExtAlloc[9] = 1;
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(){
	fExpandRatio = 200;
	fFront = 0;
	fMaxFront=0;
	fWork = 0;
	fNextRigidBodyMode = 0;
	fProductMTData = NULL;
    fDecomposeType = ELU;
}